

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.hpp
# Opt level: O3

TerminalInfo * __thiscall plot::TerminalInfo::detect<void>(TerminalInfo *this)

{
  undefined1 auVar1 [13];
  undefined1 auVar2 [13];
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  char *__s_00;
  char *pcVar8;
  size_type sVar9;
  size_type sVar10;
  long lVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  TerminalMode TVar12;
  char (*needle) [8];
  char (*needle_00) [7];
  TerminalMode TVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Color CVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  string_view terminator;
  string_view terminator_00;
  string_view cmd;
  string_view cmd_00;
  string_view haystack;
  string_view haystack_00;
  string_view haystack_01;
  Color32 c;
  string response;
  undefined4 local_5c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  iVar5 = isatty(this->term_);
  if (iVar5 == 0) {
    return this;
  }
  __s = getenv("TERM");
  if (__s == (char *)0x0) {
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  }
  else {
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)strlen(__s);
  }
  __s_00 = getenv("COLORTERM");
  if (__s_00 == (char *)0x0) {
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
  }
  else {
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)strlen(__s_00);
  }
  pcVar8 = getenv("VTE_VERSION");
  if (pcVar8 == (char *)0x0) {
    bVar14 = true;
  }
  else {
    bVar14 = *pcVar8 == '\0';
  }
  local_50._M_dataplus._M_p = (pointer)paVar7;
  local_50._M_string_length = (size_type)__s;
  sVar9 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_50,"xterm",0,5);
  if (bVar14) {
    local_50._M_dataplus._M_p = (pointer)local_58;
    local_50._M_string_length = (size_type)__s_00;
    sVar10 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
             find((basic_string_view<char,_std::char_traits<char>_> *)&local_50,"truecolor",0,9);
    TVar13 = Ansi;
    bVar14 = true;
    if (sVar10 != 0xffffffffffffffff) {
      bVar3 = true;
      goto LAB_00106d66;
    }
    local_50._M_dataplus._M_p = (pointer)paVar7;
    local_50._M_string_length = (size_type)__s;
    sVar10 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
             find((basic_string_view<char,_std::char_traits<char>_> *)&local_50,"cygwin",0,6);
    if (sVar10 == 0xffffffffffffffff) {
      local_50._M_dataplus._M_p = (pointer)local_58;
      local_50._M_string_length = (size_type)__s_00;
      sVar10 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>
               ::find((basic_string_view<char,_std::char_traits<char>_> *)&local_50,"cygwin",0,6);
      if (sVar10 == 0xffffffffffffffff) {
        needle = (char (*) [8])0x7;
        local_50._M_dataplus._M_p = (pointer)paVar7;
        local_50._M_string_length = (size_type)__s;
        sVar10 = std::experimental::fundamentals_v1::
                 basic_string_view<char,_std::char_traits<char>_>::find
                           ((basic_string_view<char,_std::char_traits<char>_> *)&local_50,"konsole",
                            0,7);
        if (sVar10 == 0xffffffffffffffff) {
          haystack._M_str = "konsole";
          haystack._M_len = (size_t)__s_00;
          bVar4 = detail::contains<char_const(&)[8]>
                            ((detail *)local_58->_M_local_buf,haystack,needle);
          bVar3 = true;
          TVar13 = Ansi;
          bVar14 = true;
          if (bVar4) goto LAB_00106d66;
          goto LAB_00106c9e;
        }
      }
    }
    bVar3 = true;
    TVar13 = Ansi;
    bVar14 = true;
    goto LAB_00106d66;
  }
  TVar13 = Ansi;
  bVar14 = true;
  if ('3' < *pcVar8) {
    bVar3 = true;
    goto LAB_00106d66;
  }
  if ((*pcVar8 == '3') && (bVar3 = true, '5' < pcVar8[1])) goto LAB_00106d66;
LAB_00106c9e:
  local_50._M_dataplus._M_p = (pointer)paVar7;
  local_50._M_string_length = (size_type)__s;
  sVar10 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
           find((basic_string_view<char,_std::char_traits<char>_> *)&local_50,"256",0,3);
  TVar13 = Ansi;
  if (sVar10 == 0xffffffffffffffff) {
    bVar14 = local_58 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    if (sVar9 != 0xffffffffffffffff || bVar14) {
      bVar3 = false;
      goto LAB_00106d66;
    }
    local_50._M_dataplus._M_p = (pointer)paVar7;
    local_50._M_string_length = (size_type)__s;
    sVar10 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
             find((basic_string_view<char,_std::char_traits<char>_> *)&local_50,"screen",0,6);
    if (((sVar10 == 0xffffffffffffffff) &&
        (local_50._M_dataplus._M_p = (pointer)paVar7, local_50._M_string_length = (size_type)__s,
        sVar10 = std::experimental::fundamentals_v1::
                 basic_string_view<char,_std::char_traits<char>_>::find
                           ((basic_string_view<char,_std::char_traits<char>_> *)&local_50,"vt100",0,
                            5), sVar10 == 0xffffffffffffffff)) &&
       (local_50._M_dataplus._M_p = (pointer)paVar7, local_50._M_string_length = (size_type)__s,
       sVar10 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>
                ::find((basic_string_view<char,_std::char_traits<char>_> *)&local_50,"color",0,5),
       sVar10 == 0xffffffffffffffff)) {
      needle_00 = (char (*) [7])0x4;
      local_50._M_dataplus._M_p = (pointer)paVar7;
      local_50._M_string_length = (size_type)__s;
      sVar10 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>
               ::find((basic_string_view<char,_std::char_traits<char>_> *)&local_50,"ansi",0,4);
      if (sVar10 == 0xffffffffffffffff) {
        haystack_00._M_str = "cygwin";
        haystack_00._M_len = (size_t)__s;
        bVar14 = detail::contains<char_const(&)[7]>
                           ((detail *)paVar7->_M_local_buf,haystack_00,needle_00);
        if (bVar14) {
          bVar14 = false;
          bVar3 = false;
          TVar13 = Ansi;
          goto LAB_00106d66;
        }
        haystack_01._M_str = "linux";
        haystack_01._M_len = (size_t)__s;
        bVar14 = detail::contains<char_const(&)[6]>
                           ((detail *)paVar7->_M_local_buf,haystack_01,(char (*) [6])needle_00);
        TVar13 = (uint)bVar14 * 2;
        bVar14 = false;
        goto LAB_00106cd5;
      }
    }
    bVar3 = false;
    TVar13 = Ansi;
    bVar14 = false;
  }
  else {
    bVar14 = true;
LAB_00106cd5:
    bVar3 = false;
  }
LAB_00106d66:
  if (this->mode == None) {
    if (bVar14) {
      TVar13 = Ansi256;
    }
    TVar12 = Iso24bit;
    if (!bVar3) {
      TVar12 = TVar13;
    }
    this->mode = TVar12;
  }
  if (sVar9 != 0xffffffffffffffff) {
    auVar15._4_4_ = -(uint)((this->foreground_color).g != (float)0x3f666666);
    auVar15._0_4_ = -(uint)((this->foreground_color).r != (float)0x3f666666);
    auVar15._8_4_ = -(uint)((this->foreground_color).b != (float)0x3f666666);
    auVar15._12_4_ = -(uint)((this->foreground_color).a != 1.0);
    uVar6 = movmskps((int)sVar9,auVar15);
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uVar6;
    if (uVar6 == 0) {
      terminator._M_str = "\a\\";
      terminator._M_len = 2;
      cmd._M_str = "\x1b]10;?\x1b\\";
      cmd._M_len = 8;
      query<void>(&local_50,this,cmd,terminator);
      if (((char *)local_50._M_string_length != (char *)0x0) &&
         (lVar11 = std::__cxx11::string::find((char *)&local_50,0x10a301,0), lVar11 != -1)) {
        local_5c = 0xffffffff;
        iVar5 = __isoc99_sscanf(local_50._M_dataplus._M_p + lVar11 + 4,
                                "%2hhx%*2x/%2hhx%*2x/%2hhx%*2x",&local_5c,(long)&local_5c + 1,
                                (long)&local_5c + 2);
        if (iVar5 == 3) {
          auVar1[0xc] = (char)(local_5c >> 0x18);
          auVar1._0_12_ = ZEXT712(0);
          auVar16._0_4_ = (float)(local_5c & 0xff);
          auVar16._4_4_ = (float)(local_5c >> 8 & 0xff);
          auVar16._8_4_ = (float)(int)CONCAT32(auVar1._10_3_,(ushort)(byte)(local_5c >> 0x10));
          auVar16._12_4_ = (float)(uint3)(auVar1._10_3_ >> 0x10);
          CVar17 = (Color)divps(auVar16,_DAT_0010a050);
          this->foreground_color = CVar17;
        }
      }
      paVar7 = &local_50.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar7) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        paVar7 = extraout_RAX;
      }
    }
    auVar18._4_4_ = -(uint)((this->background_color).g != 0.0);
    auVar18._0_4_ = -(uint)((this->background_color).r != 0.0);
    auVar18._8_4_ = -(uint)((this->background_color).b != 0.0);
    auVar18._12_4_ = -(uint)((this->background_color).a != 1.0);
    iVar5 = movmskps((int)paVar7,auVar18);
    if (iVar5 == 0) {
      terminator_00._M_str = "\a\\";
      terminator_00._M_len = 2;
      cmd_00._M_str = "\x1b]11;?\x1b\\";
      cmd_00._M_len = 8;
      query<void>(&local_50,this,cmd_00,terminator_00);
      if (((char *)local_50._M_string_length != (char *)0x0) &&
         (lVar11 = std::__cxx11::string::find((char *)&local_50,0x10a301,0), lVar11 != -1)) {
        local_5c = 0xff000000;
        iVar5 = __isoc99_sscanf(local_50._M_dataplus._M_p + lVar11 + 4,
                                "%2hhx%*2x/%2hhx%*2x/%2hhx%*2x",&local_5c,(long)&local_5c + 1,
                                (long)&local_5c + 2);
        if (iVar5 == 3) {
          auVar2[0xc] = (char)(local_5c >> 0x18);
          auVar2._0_12_ = ZEXT712(0);
          auVar19._0_4_ = (float)(local_5c & 0xff);
          auVar19._4_4_ = (float)(local_5c >> 8 & 0xff);
          auVar19._8_4_ = (float)(int)CONCAT32(auVar2._10_3_,(ushort)(byte)(local_5c >> 0x10));
          auVar19._12_4_ = (float)(uint3)(auVar2._10_3_ >> 0x10);
          CVar17 = (Color)divps(auVar19,_DAT_0010a050);
          this->background_color = CVar17;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return this;
}

Assistant:

TerminalInfo& TerminalInfo::detect() {
    if (!is_terminal())
        return *this;

    string_view name, colorterm, vte_version;

    auto tmp = std::getenv(u8"TERM");
    if (tmp) name = tmp;

    tmp = std::getenv(u8"COLORTERM");
    if (tmp) colorterm = tmp;

    tmp = std::getenv(u8"VTE_VERSION");
    if (tmp) vte_version = tmp;

    bool xterm_like = detail::contains(name, u8"xterm");

    bool has_truecolor =
        !vte_version.empty()
            ? (vte_version[0] > '3' || (vte_version[0] == '3' && vte_version[1] >= '6')) // VTE >= 0.36 supports true color
            : detail::contains(colorterm, u8"truecolor") ||
              detail::contains(name, u8"cygwin") ||
              detail::contains(colorterm, u8"cygwin") ||
              detail::contains(name, u8"konsole") ||
              detail::contains(colorterm, u8"konsole");

    bool has_256color = has_truecolor ||
                        detail::contains(name, u8"256") ||
                        !colorterm.empty();

    bool has_ansi = has_256color ||
                    xterm_like ||
                    detail::contains(name, u8"screen") ||
                    detail::contains(name, u8"vt100") ||
                    detail::contains(name, u8"color") ||
                    detail::contains(name, u8"ansi") ||
                    detail::contains(name, u8"cygwin") ||
                    detail::contains(name, u8"linux");

    if (mode == TerminalMode::None)
        mode = has_truecolor ? TerminalMode::Iso24bit
                             : has_256color ? TerminalMode::Ansi256
                                            : has_ansi ? TerminalMode::Ansi
                                                       : TerminalMode::None;

    if (xterm_like && foreground_color == Color(0.9f, 0.9f, 0.9f, 1)) {
        auto response = query(u8"\x1b]10;?\x1b\\", u8"\a\\");
        if (!response.empty()) {
            auto pos = response.find(u8"rgb:");
            if (pos != std::string::npos) {
                pos += 4;
                Color32 c = { 255, 255, 255, 255 };
                if (sscanf(response.c_str() + pos, u8"%2hhx%*2x/%2hhx%*2x/%2hhx%*2x", &c.r, &c.g, &c.b) == 3)
                    foreground_color = c;
            }
        }
    }

    if (xterm_like && background_color == Color(0, 0, 0, 1)) {
        auto response = query(u8"\x1b]11;?\x1b\\", u8"\a\\");
        if (!response.empty()) {
            auto pos = response.find(u8"rgb:");
            if (pos != std::string::npos) {
                pos += 4;
                Color32 c = { 0, 0, 0, 255 };
                if (sscanf(response.c_str() + pos, u8"%2hhx%*2x/%2hhx%*2x/%2hhx%*2x", &c.r, &c.g, &c.b) == 3)
                    background_color = c;
            }
        }
    }

    return *this;
}